

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_lda(DisasContext_conflict1 *s,arg_LDA *a,MemOp mop)

{
  int reg;
  uint64_t uVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  TCGTemp *pTVar2;
  TCGContext_conflict1 *tcg_ctx;
  
  uVar1 = s->features;
  if (((uint)uVar1 >> 0x1b & 1) != 0) {
    reg = a->rn;
    if ((reg == 0xf) || (a->rt == 0xf)) {
      unallocated_encoding_aarch64(s);
    }
    else {
      s_00 = s->uc->tcg_ctx;
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      load_reg_var(s,(TCGv_i32)((long)ts - (long)s_00),reg);
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      gen_aa32_ld_i32(s,(TCGv_i32)((long)pTVar2 - (long)s_00),(TCGv_i32)((long)ts - (long)s_00),
                      s->mmu_idx & 0xf,s->be_data | mop);
      disas_set_da_iss(s,mop,a->rt | ISSIsAcqRel);
      tcg_temp_free_internal_aarch64(s_00,ts);
      store_reg(s,a->rt,(TCGv_i32)((long)pTVar2 - (long)s_00));
      tcg_gen_mb_aarch64(s_00,TCG_BAR_STRL|TCG_MO_ALL);
    }
  }
  return (_Bool)((byte)(uVar1 >> 0x18) >> 3 & 1);
}

Assistant:

static bool op_lda(DisasContext *s, arg_LDA *a, MemOp mop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_8) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rn == 15 || a->rt == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = load_reg(s, a->rn);
    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s), mop | s->be_data);
    disas_set_da_iss(s, mop, a->rt | ISSIsAcqRel);
    tcg_temp_free_i32(tcg_ctx, addr);

    store_reg(s, a->rt, tmp);
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    return true;
}